

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int i_2;
  ulong uVar5;
  ulong uVar6;
  int i;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  uint _w;
  uint uVar14;
  int q;
  long lVar15;
  bool bVar16;
  float fVar17;
  Mat mins;
  Mat local_68;
  size_t local_38;
  
  uVar11 = a->w;
  uVar1 = a->h;
  _w = a->c;
  uVar6 = (ulong)_w;
  if (dim == 0) {
    uVar14 = 1;
    goto LAB_001131d6;
  }
  switch(dim) {
  default:
    goto switchD_001131a5_caseD_0;
  case 1:
    uVar14 = _w;
LAB_001131d6:
    Mat::create(b,uVar14,4);
    goto switchD_001131a5_caseD_0;
  case 2:
    uVar14 = uVar1;
    uVar8 = _w;
    break;
  case -2:
    uVar14 = uVar11;
    uVar8 = uVar1;
    break;
  case -1:
    uVar14 = uVar11;
    goto LAB_001131d6;
  }
  Mat::create(b,uVar14,uVar8,4);
switchD_001131a5_caseD_0:
  if (b->data == (void *)0x0) {
    return -100;
  }
  if ((long)b->c * b->cstep == 0) {
    return -100;
  }
  uVar14 = uVar1 * uVar11;
  if (dim == 0) {
    Mat::Mat(&mins,_w,4);
    if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) {
LAB_00113552:
      Mat::~Mat(&mins);
      return -100;
    }
    uVar12 = 0;
    uVar9 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar9 = uVar12;
    }
    if ((int)_w < 1) {
      uVar6 = uVar12;
    }
    for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
      Mat::channel(&local_68,a,(int)uVar12);
      pvVar13 = local_68.data;
      Mat::~Mat(&local_68);
      fVar17 = 0.0;
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        fVar17 = fVar17 + *(float *)((long)pvVar13 + uVar5 * 4);
      }
      *(float *)((long)mins.data + uVar12 * 4) = fVar17;
    }
    fVar17 = 0.0;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      fVar17 = fVar17 + *(float *)((long)mins.data + uVar9 * 4);
    }
    *(float *)b->data = fVar17 * v0;
LAB_0011335e:
    Mat::~Mat(&mins);
  }
  else {
    switch(dim) {
    case 0:
      goto switchD_0011323f_caseD_0;
    case 1:
      uVar9 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar9 = 0;
      }
      if ((int)_w < 1) {
        uVar6 = 0;
      }
      for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
        Mat::channel(&mins,a,(int)uVar12);
        pvVar13 = mins.data;
        Mat::~Mat(&mins);
        fVar17 = 0.0;
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          fVar17 = fVar17 + *(float *)((long)pvVar13 + uVar5 * 4);
        }
        *(float *)((long)b->data + uVar12 * 4) = fVar17 * v0;
      }
      break;
    case 2:
      uVar14 = 0;
      if (0 < (int)uVar11) {
        uVar14 = uVar11;
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      if ((int)_w < 1) {
        _w = 0;
      }
      for (uVar8 = 0; uVar8 != _w; uVar8 = uVar8 + 1) {
        Mat::channel(&mins,a,uVar8);
        pvVar13 = mins.data;
        Mat::~Mat(&mins);
        Mat::channel(&mins,b,uVar8);
        pvVar2 = mins.data;
        Mat::~Mat(&mins);
        for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
          fVar17 = 0.0;
          uVar7 = uVar14;
          while (bVar16 = uVar7 != 0, uVar7 = uVar7 - 1, bVar16) {
            fVar17 = fVar17 + *(float *)((long)pvVar13 + uVar6 * 4);
          }
          *(float *)((long)pvVar2 + uVar6 * 4) = fVar17 * v0;
          pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar11 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(b,0.0);
      uVar11 = 0;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      if ((int)_w < 1) {
        _w = 0;
      }
      for (; uVar11 != _w; uVar11 = uVar11 + 1) {
        Mat::channel(&mins,a,uVar11);
        pvVar2 = mins.data;
        Mat::~Mat(&mins);
        pvVar13 = b->data;
        for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)pvVar13 + uVar6 * 4) =
               *(float *)((long)pvVar2 + uVar6 * 4) + *(float *)((long)pvVar13 + uVar6 * 4);
        }
      }
      pvVar13 = b->data;
      for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar13 + uVar6 * 4) * v0;
      }
      break;
    case -1:
      Mat::Mat(&mins,uVar11,1,_w,4);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_00113552;
      Mat::fill(&mins,0.0);
      uVar9 = 0;
      uVar12 = 0;
      if (0 < (int)uVar11) {
        uVar12 = (ulong)uVar11;
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      if ((int)_w < 1) {
        uVar6 = 0;
      }
      for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
        Mat::channel(&local_68,a,(int)uVar9);
        pvVar13 = local_68.data;
        Mat::~Mat(&local_68);
        sVar3 = mins.cstep;
        pvVar2 = mins.data;
        local_38 = mins.elemsize;
        local_68.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        lVar15 = sVar3 * local_38 * uVar9;
        for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
          for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar2 + uVar10 * 4 + lVar15) =
                 *(float *)((long)pvVar13 + uVar5 * 4) +
                 *(float *)((long)pvVar2 + uVar10 * 4 + lVar15);
          }
          pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar11 * 4);
        }
      }
      Mat::fill(b,0.0);
      for (uVar9 = 0; sVar4 = mins.cstep, sVar3 = mins.elemsize, pvVar13 = mins.data, uVar9 != uVar6
          ; uVar9 = uVar9 + 1) {
        local_68.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_68.refcount = (int *)0x0;
        local_68.elemsize = mins.elemsize;
        local_68.dims = 2;
        local_68.w = mins.w;
        local_68.h = mins.h;
        local_68.c = 1;
        local_68.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_68);
        pvVar2 = b->data;
        for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
          *(float *)((long)pvVar2 + uVar5 * 4) =
               *(float *)((long)pvVar13 + uVar5 * 4 + sVar4 * sVar3 * uVar9) +
               *(float *)((long)pvVar2 + uVar5 * 4);
        }
      }
      pvVar13 = b->data;
      for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar13 + uVar6 * 4) * v0;
      }
      goto LAB_0011335e;
    }
  }
switchD_0011323f_caseD_0:
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels);
        if (sums.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}